

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iqueuehead.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int i;
  int iVar4;
  
  puVar1 = (undefined8 *)malloc(0x10);
  *puVar1 = puVar1;
  iVar4 = 0;
  puVar2 = puVar1;
  do {
    puVar3 = (undefined8 *)malloc(0x18);
    *(int *)(puVar3 + 2) = iVar4;
    puVar3[1] = puVar2;
    *puVar3 = puVar1;
    *puVar2 = puVar3;
    iVar4 = iVar4 + 1;
    puVar2 = puVar3;
  } while (iVar4 != 10);
  puVar1[1] = puVar3;
  return 0;
}

Assistant:

int main()
{
    mypcb *mypb = (mypcb*)malloc(sizeof(struct MYPCB));
    iqueue_init(&mypb->snd_queue);
    for(int i = 0;i<10;i++)
    {
        SEG *myseg = (struct SEG*)malloc(sizeof(struct SEG));
        myseg->id = i;
        iqueue_init(&myseg->node);
        iqueue_add_tail(&myseg->node, &mypb->snd_queue);
    }
    return 0;
}